

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::GrowNoAnnotate
          (RepeatedField<absl::lts_20250127::Cord> *this,bool was_soo,int old_size,int new_size)

{
  Cord *this_00;
  CordRep *pCVar1;
  SooRep *this_01;
  uint uVar2;
  Nullable<const_char_*> pcVar3;
  Arena *arena;
  char *pcVar4;
  Cord *pCVar5;
  undefined7 in_register_00000031;
  long lVar6;
  size_t size;
  int v2;
  ulong uVar7;
  ulong uVar8;
  SizedPtr SVar9;
  LogMessage local_58;
  uint local_44;
  SooRep *local_40;
  unsigned_long local_38;
  
  v2 = 0;
  if ((int)CONCAT71(in_register_00000031,was_soo) == 0) {
    v2 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  local_44 = old_size;
  pcVar3 = absl::lts_20250127::log_internal::Check_GTImpl(new_size,v2,"new_size > old_capacity");
  if (pcVar3 != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x4ad,pcVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  arena = GetArena(this);
  uVar2 = internal::CalculateReserveSize<absl::lts_20250127::Cord,16>(v2,new_size);
  uVar8 = (ulong)uVar2;
  uVar7 = (ulong)(int)uVar2;
  local_38 = 0xffffffffffffffe;
  local_58._0_8_ = uVar7;
  pcVar3 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                     ((unsigned_long *)&local_58,&local_38,
                      "static_cast<size_t>(new_size) <= (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) / sizeof(Element)"
                     );
  if (pcVar3 == (Nullable<const_char_*>)0x0) {
    size = uVar7 * 0x10 + 0x10;
    local_40 = &this->soo_rep_;
    if (arena == (Arena *)0x0) {
      local_58._0_8_ = uVar7 & 0xfffffffffffffff;
      local_38 = 0x7fffffff;
      pcVar3 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                         ((unsigned_long *)&local_58,&local_38,
                          "(bytes - kHeapRepHeaderSize) / sizeof(Element) <= static_cast<size_t>(std::numeric_limits<int>::max())"
                         );
      if (pcVar3 != (Nullable<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                   ,0x4bc,pcVar3);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (&local_58,
                   (char (*) [59])"Requested size is too large to fit element count into int.");
        goto LAB_00262655;
      }
      SVar9 = internal::AllocateAtLeast(size);
      pcVar4 = (char *)SVar9.p;
      uVar8 = SVar9.n - 0x10 >> 4;
      if (0x7ffffffe < uVar8) {
        uVar8 = 0x7fffffff;
      }
    }
    else {
      pcVar4 = Arena::CreateArray<char>(arena,size);
    }
    uVar2 = local_44;
    *(Arena **)pcVar4 = arena;
    if (0 < (int)local_44) {
      pCVar5 = elements((RepeatedField<absl::lts_20250127::Cord> *)local_40,was_soo);
      for (lVar6 = 0; (ulong)uVar2 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
        this_00 = (Cord *)((long)&(pCVar5->contents_).data_.rep_.field_0 + lVar6);
        pCVar1 = (this_00->contents_).data_.rep_.field_0.as_tree.rep;
        *(cordz_info_t *)(pcVar4 + lVar6 + 0x10) =
             (this_00->contents_).data_.rep_.field_0.as_tree.cordz_info;
        *(CordRep **)((long)(pcVar4 + lVar6 + 0x10) + 8) = pCVar1;
        (this_00->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
        (this_00->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
        absl::lts_20250127::Cord::~Cord(this_00);
      }
    }
    this_01 = local_40;
    if (!was_soo) {
      InternalDeallocate<false>((RepeatedField<absl::lts_20250127::Cord> *)local_40);
    }
    internal::SooRep::set_non_soo(this_01,was_soo,(int)uVar8,pcVar4 + 0x10);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x4b6,pcVar3);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&local_58,(char (*) [48])"Requested size is too large to fit into size_t.");
LAB_00262655:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_58);
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::GrowNoAnnotate(bool was_soo,
                                                              int old_size,
                                                              int new_size) {
  const int old_capacity = Capacity(was_soo);
  ABSL_DCHECK_GT(new_size, old_capacity);
  HeapRep* new_rep;
  Arena* arena = GetArena();

  new_size = internal::CalculateReserveSize<Element, kHeapRepHeaderSize>(
      old_capacity, new_size);

  ABSL_DCHECK_LE(static_cast<size_t>(new_size),
                 (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) /
                     sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kHeapRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    ABSL_DCHECK_LE((bytes - kHeapRepHeaderSize) / sizeof(Element),
                   static_cast<size_t>(std::numeric_limits<int>::max()))
        << "Requested size is too large to fit element count into int.";
    internal::SizedPtr res = internal::AllocateAtLeast(bytes);
    size_t num_available =
        std::min((res.n - kHeapRepHeaderSize) / sizeof(Element),
                 static_cast<size_t>(std::numeric_limits<int>::max()));
    new_size = static_cast<int>(num_available);
    new_rep = static_cast<HeapRep*>(res.p);
  } else {
    new_rep =
        reinterpret_cast<HeapRep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;

  if (old_size > 0) {
    Element* pnew = static_cast<Element*>(new_rep->elements());
    Element* pold = elements(was_soo);
    // TODO: add absl::is_trivially_relocatable<Element>
    if (std::is_trivial<Element>::value) {
      memcpy(static_cast<void*>(pnew), pold, old_size * sizeof(Element));
    } else {
      for (Element* end = pnew + old_size; pnew != end; ++pnew, ++pold) {
        ::new (static_cast<void*>(pnew)) Element(std::move(*pold));
        pold->~Element();
      }
    }
  }
  if (!was_soo) InternalDeallocate();

  soo_rep_.set_non_soo(was_soo, new_size, new_rep->elements());
}